

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setCPUThreadCount
          (BeagleCPUImpl<double,_1,_0> *this,int threadCount)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int *piVar6;
  double *pdVar7;
  int i_1;
  uint uVar8;
  ulong uVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  
  if (threadCount < 1) {
    iVar4 = -5;
  }
  else {
    this->kThreadingEnabled = false;
    this->kAutoPartitioningEnabled = false;
    iVar4 = 0;
    if ((this->kFlags & 0x40000000) != 0) {
      iVar3 = std::thread::hardware_concurrency();
      uVar1 = this->kPatternCount;
      uVar9 = (ulong)uVar1;
      uVar8 = 2;
      if (this->kStateCount < 5) {
        uVar8 = (uint)(iVar3 < 0x10) << 9 | 0x100;
      }
      this->kMinPatternCount = uVar8;
      if ((2 < iVar3) && (iVar4 = 0, (int)uVar8 <= (int)uVar1)) {
        uVar10 = 0;
        uVar2 = (ulong)uVar1 / (ulong)(uVar8 >> 1);
        uVar11 = (ulong)(uint)threadCount;
        if ((uint)uVar2 < (uint)threadCount) {
          uVar11 = uVar2;
        }
        pvVar5 = malloc(uVar9 * 4);
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          iVar4 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                       (long)(int)(uVar9 / uVar11));
          if ((int)uVar11 <= iVar4) {
            iVar4 = (int)uVar11 + -1;
          }
          *(int *)((long)pvVar5 + uVar10 * 4) = iVar4;
        }
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,uVar11,pvVar5);
        piVar6 = (int *)malloc((long)this->kPartitionCount *
                               (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24);
        this->gAutoPartitionOperations = piVar6;
        if (this->kMinPatternCount * 4 <= this->kPatternCount) {
          piVar6 = (int *)malloc(uVar11 * 4);
          this->gAutoPartitionIndices = piVar6;
          for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
            piVar6[uVar9] = (int)uVar9;
          }
          pdVar7 = (double *)malloc(uVar11 << 3);
          this->gAutoPartitionOutSumLogLikelihoods = pdVar7;
          this->kAutoRootPartitioningEnabled = true;
        }
        iVar4 = 0;
        this->kAutoPartitioningEnabled = true;
      }
    }
  }
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCPUThreadCount(int threadCount) {

    if (threadCount < 1)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > threadCount) {
                partitionCount = threadCount;
            }

            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = true;
            }

            kAutoPartitioningEnabled = true;
        }
    }

    return BEAGLE_SUCCESS;
}